

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat_meat.hpp
# Opt level: O1

void __thiscall
arma::Mat<double>::
Mat<arma::eGlue<arma::Mat<double>,arma::Mat<double>,arma::eglue_minus>,arma::eop_scalar_div_post>
          (Mat<double> *this,
          eOp<arma::eGlue<arma::Mat<double>,_arma::Mat<double>,_arma::eglue_minus>,_arma::eop_scalar_div_post>
          *X)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Mat<double> *pMVar5;
  eGlue<arma::Mat<double>,_arma::Mat<double>,_arma::eglue_minus> *peVar6;
  double *pdVar7;
  double *pdVar8;
  uword uVar9;
  char *in_RAX;
  double *pdVar10;
  ulong uVar11;
  char (*x) [39];
  ulong uVar12;
  char *local_18;
  
  x = (char (*) [39])&local_18;
  pMVar5 = (((X->P).Q)->P1).Q;
  uVar2 = pMVar5->n_rows;
  this->n_rows = uVar2;
  uVar3 = pMVar5->n_cols;
  this->n_cols = uVar3;
  uVar4 = pMVar5->n_elem;
  this->n_elem = uVar4;
  this->mem = (double *)0x0;
  this->n_alloc = 0;
  this->vec_state = 0;
  this->mem_state = 0;
  if ((0xffff < uVar3 || 0xffff < uVar2) && (4294967295.0 < (double)uVar3 * (double)uVar2)) {
    local_18 = "Mat::init(): requested size is too large; suggest to enable ARMA_64BIT_WORD";
    arma_stop_logic_error<char_const*>
              ((arma *)&local_18,(char **)CONCAT71(0x100,0xffff < uVar3 || 0xffff < uVar2));
LAB_0014b962:
    arma_stop_bad_alloc<char[39]>(x);
  }
  if (uVar4 < 0x11) {
    pdVar10 = this->mem_local;
    if ((ulong)uVar4 == 0) {
      pdVar10 = (double *)0x0;
    }
    this->mem = pdVar10;
    uVar9 = 0;
  }
  else {
    x = (char (*) [39])((ulong)uVar4 << 3);
    local_18 = in_RAX;
    pdVar10 = (double *)lkalloc::malloc((size_t)x);
    if (pdVar10 == (double *)0x0) goto LAB_0014b962;
    this->mem = pdVar10;
    uVar9 = this->n_elem;
  }
  this->n_alloc = uVar9;
  dVar1 = X->aux;
  pdVar10 = this->mem;
  peVar6 = (X->P).Q;
  pMVar5 = (peVar6->P1).Q;
  uVar11 = (ulong)pMVar5->n_elem;
  if (((ulong)pdVar10 & 0xf) == 0) {
    pdVar7 = pMVar5->mem;
    if ((((ulong)pdVar7 & 0xf) == 0) && (pdVar8 = ((peVar6->P2).Q)->mem, ((ulong)pdVar8 & 0xf) == 0)
       ) {
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          pdVar10[uVar12] = (pdVar7[uVar12] - pdVar8[uVar12]) / dVar1;
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    else if (uVar11 != 0) {
      pdVar8 = ((peVar6->P2).Q)->mem;
      uVar12 = 0;
      do {
        pdVar10[uVar12] = (pdVar7[uVar12] - pdVar8[uVar12]) / dVar1;
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
  }
  else if (uVar11 != 0) {
    pdVar7 = pMVar5->mem;
    pdVar8 = ((peVar6->P2).Q)->mem;
    uVar12 = 0;
    do {
      pdVar10[uVar12] = (pdVar7[uVar12] - pdVar8[uVar12]) / dVar1;
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
  }
  return;
}

Assistant:

inline
Mat<eT>::Mat(const eOp<T1, eop_type>& X)
  : n_rows(X.get_n_rows())
  , n_cols(X.get_n_cols())
  , n_elem(X.get_n_elem())
  , n_alloc()
  , vec_state(0)
  , mem_state(0)
  , mem()
  {
  arma_debug_sigprint_this(this);
  
  arma_type_check(( is_same_type< eT, typename T1::elem_type >::no ));
  
  init_cold();
  
  eop_type::apply(*this, X);
  }